

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

optional<long> __thiscall
anon_unknown.dwarf_1440904::SHDescriptor::MaxSatisfactionWeight(SHDescriptor *this,bool use_max_sig)

{
  long lVar1;
  long lVar2;
  _Storage<long,_true> _Var3;
  _Storage<long,_true> _Var4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  optional<long> oVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  auVar6 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                 ._M_t + 0xa0))();
  _Var3._M_value = auVar6._0_8_;
  _Var4._M_value = _Var3._M_value;
  if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar6 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                   ._M_t + 0x60))();
    _Var4._M_value = auVar6._0_8_;
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      auVar6 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                       super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                     super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                     ._M_t + 0x58))();
      if ((auVar6._0_8_ & 0x1ffffffff) == 0x100000002) {
        lVar1 = _Var3._M_value + _Var4._M_value * 4;
      }
      else {
        lVar1 = (_Var4._M_value + _Var3._M_value) * 4;
      }
      _Var4._M_value = lVar1 + 4;
      uVar5 = CONCAT71(auVar6._9_7_,1);
      goto LAB_003965dd;
    }
  }
  uVar5 = 0;
LAB_003965dd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
         = uVar5;
    oVar7.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var4._M_value;
    return (optional<long>)
           oVar7.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionWeight(bool use_max_sig) const override {
        if (const auto sat_size = m_subdescriptor_args[0]->MaxSatSize(use_max_sig)) {
            if (const auto subscript_size = m_subdescriptor_args[0]->ScriptSize()) {
                // The subscript is never witness data.
                const auto subscript_weight = (1 + *subscript_size) * WITNESS_SCALE_FACTOR;
                // The weight depends on whether the inner descriptor is satisfied using the witness stack.
                if (IsSegwit()) return subscript_weight + *sat_size;
                return subscript_weight + *sat_size * WITNESS_SCALE_FACTOR;
            }
        }
        return {};
    }